

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::loadTestNamesFromFile(ConfigData *config,string *_filename)

{
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  domain_error *this;
  istream *piVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string local_298;
  undefined1 local_278 [8];
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  istream local_220 [8];
  ifstream f;
  string *_filename_local;
  ConfigData *config_local;
  
  uVar3 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,uVar3,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::__cxx11::string::string((string *)local_278);
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_220,(string *)local_278);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) break;
      trim(&local_298,(string *)local_278);
      std::__cxx11::string::operator=((string *)local_278,(string *)&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      uVar5 = std::__cxx11::string::empty();
      if (((uVar5 & 1) == 0) && (bVar2 = startsWith((string *)local_278,'#'), !bVar2)) {
        bVar2 = startsWith((string *)local_278,'\"');
        if (!bVar2) {
          std::operator+(&local_2d8,'\"',
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_278);
          std::operator+(&local_2b8,&local_2d8,'\"');
          std::__cxx11::string::operator=((string *)local_278,(string *)&local_2b8);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::__cxx11::string::~string((string *)&local_2d8);
        }
        std::operator+(&local_2f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_278,',');
        addTestOrTags(config,&local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
      }
    }
    std::__cxx11::string::~string((string *)local_278);
    std::ifstream::~ifstream(local_220);
    return;
  }
  line.field_2._M_local_buf[0xf] = '\x01';
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_250,"Unable to load input file: ",_filename);
  std::domain_error::domain_error(this,(string *)&local_250);
  line.field_2._M_local_buf[0xf] = '\0';
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline void loadTestNamesFromFile( ConfigData& config, std::string const& _filename ) {
        std::ifstream f( _filename.c_str() );
        if( !f.is_open() )
            throw std::domain_error( "Unable to load input file: " + _filename );

        std::string line;
        while( std::getline( f, line ) ) {
            line = trim(line);
            if( !line.empty() && !startsWith( line, '#' ) ) {
                if( !startsWith( line, '"' ) )
                    line = '"' + line + '"';
                addTestOrTags( config, line + ',' );
            }
        }
    }